

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void HUF_fillDTableX2(HUF_DEltX2 *DTable,U32 targetLog,sortedSymbol_t *sortedList,U32 *rankStart,
                     rankValCol_t *rankValOrigin,U32 maxWeight,U32 nbBitsBaseline)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  U32 tableLog;
  int minWeight_00;
  int maxWeight1;
  long in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  sortedSymbol_t *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int s;
  int minWeight;
  U32 length;
  int start;
  U32 nbBits;
  int end;
  int begin;
  int wEnd;
  int w;
  U32 minBits;
  int scaleLog;
  U32 *rankVal;
  int local_74;
  int iVar4;
  undefined2 uVar5;
  U16 baseSeq;
  U32 nbBits_00;
  undefined4 in_stack_ffffffffffffffc0;
  sortedSymbol_t *rankStart_00;
  
  iVar2 = in_stack_00000008 - in_ESI;
  uVar3 = in_stack_00000008 - in_R9D;
  tableLog = in_R9D + 1;
  rankStart_00 = in_R8;
  for (nbBits_00 = 1; (int)nbBits_00 < (int)tableLog; nbBits_00 = nbBits_00 + 1) {
    local_74 = *(int *)(in_RCX + (long)(int)nbBits_00 * 4);
    uVar5 = (undefined2)local_74;
    baseSeq = (U16)((uint)local_74 >> 0x10);
    iVar4 = *(int *)(in_RCX + (long)(int)(nbBits_00 + 1) * 4);
    minWeight_00 = in_stack_00000008 - nbBits_00;
    if ((uint)(in_ESI - minWeight_00) < uVar3) {
      HUF_fillDTableX2ForWeight
                ((HUF_DEltX2 *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),in_R8,
                 (sortedSymbol_t *)CONCAT44(iVar2,uVar3),nbBits_00,tableLog,baseSeq,(int)in_RCX);
    }
    else {
      maxWeight1 = *(int *)(in_R8 + (long)(int)nbBits_00 * 4);
      cVar1 = (char)minWeight_00;
      for (; local_74 != iVar4; local_74 = local_74 + 1) {
        HUF_fillDTableX2Level2
                  ((HUF_DEltX2 *)CONCAT44(iVar2,uVar3),nbBits_00,tableLog,
                   (U32 *)CONCAT26(baseSeq,CONCAT24(uVar5,iVar4)),minWeight_00,maxWeight1,
                   (sortedSymbol_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),(U32 *)rankStart_00,
                   (U32)in_RCX,(U16)in_RDX);
        maxWeight1 = (1 << ((char)in_ESI - cVar1 & 0x1fU)) + maxWeight1;
      }
    }
  }
  return;
}

Assistant:

static void HUF_fillDTableX2(HUF_DEltX2* DTable, const U32 targetLog,
                           const sortedSymbol_t* sortedList,
                           const U32* rankStart, rankValCol_t* rankValOrigin, const U32 maxWeight,
                           const U32 nbBitsBaseline)
{
    U32* const rankVal = rankValOrigin[0];
    const int scaleLog = nbBitsBaseline - targetLog;   /* note : targetLog >= srcLog, hence scaleLog <= 1 */
    const U32 minBits  = nbBitsBaseline - maxWeight;
    int w;
    int const wEnd = (int)maxWeight + 1;

    /* Fill DTable in order of weight. */
    for (w = 1; w < wEnd; ++w) {
        int const begin = (int)rankStart[w];
        int const end = (int)rankStart[w+1];
        U32 const nbBits = nbBitsBaseline - w;

        if (targetLog-nbBits >= minBits) {
            /* Enough room for a second symbol. */
            int start = rankVal[w];
            U32 const length = 1U << ((targetLog - nbBits) & 0x1F /* quiet static-analyzer */);
            int minWeight = nbBits + scaleLog;
            int s;
            if (minWeight < 1) minWeight = 1;
            /* Fill the DTable for every symbol of weight w.
             * These symbols get at least 1 second symbol.
             */
            for (s = begin; s != end; ++s) {
                HUF_fillDTableX2Level2(
                    DTable + start, targetLog, nbBits,
                    rankValOrigin[nbBits], minWeight, wEnd,
                    sortedList, rankStart,
                    nbBitsBaseline, sortedList[s].symbol);
                start += length;
            }
        } else {
            /* Only a single symbol. */
            HUF_fillDTableX2ForWeight(
                DTable + rankVal[w],
                sortedList + begin, sortedList + end,
                nbBits, targetLog,
                /* baseSeq */ 0, /* level */ 1);
        }
    }
}